

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::V_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<(anonymous_namespace)::V_const&> *this,
          int *rhs)

{
  int iVar1;
  int iVar2;
  V *value;
  ostream *poVar3;
  int *value_00;
  ostringstream os;
  ulong *local_2b0;
  ulong local_2a0;
  undefined8 uStack_298;
  char *local_290;
  long local_288;
  char local_280 [8];
  undefined8 uStack_278;
  char *local_270;
  long local_268;
  char local_260 [8];
  undefined8 uStack_258;
  string local_250;
  ulong *local_230;
  size_type local_228;
  ulong local_220;
  undefined4 uStack_218;
  undefined4 uStack_214;
  ulong *local_210;
  size_type local_208;
  ulong local_200;
  undefined8 uStack_1f8;
  bool local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  value = *(V **)this;
  iVar2 = value->value;
  iVar1 = *rhs;
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"==","");
  local_290 = local_280;
  if (local_270 == local_260) {
    uStack_278 = uStack_258;
  }
  else {
    local_290 = local_270;
  }
  local_288 = local_268;
  local_268 = 0;
  local_260[0] = '\0';
  local_270 = local_260;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::V>(&local_1c8,value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_290,local_288);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  string_maker<int>::to_string_abi_cxx11_(&local_250,(string_maker<int> *)rhs,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == &local_250.field_2) {
    uStack_1f8 = local_250.field_2._8_8_;
    local_210 = &local_200;
  }
  else {
    local_210 = (ulong *)local_250._M_dataplus._M_p;
  }
  local_208 = local_250._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)local_210,local_250._M_string_length);
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == &local_250.field_2) {
    uStack_298 = local_250.field_2._8_8_;
    local_2b0 = &local_2a0;
  }
  else {
    local_2b0 = (ulong *)local_250._M_dataplus._M_p;
  }
  local_2a0 = local_250.field_2._M_allocated_capacity;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_2b0 == &local_2a0) {
    uStack_218 = (undefined4)uStack_298;
    uStack_214 = uStack_298._4_4_;
    local_230 = &local_220;
  }
  else {
    local_230 = local_2b0;
  }
  local_228 = local_250._M_string_length;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_1f0 = iVar2 == iVar1;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_230,(long)local_230 + local_250._M_string_length);
  __return_storage_ptr__->passed = local_1f0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e8,local_1e8 + local_1e0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }